

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLNode::SetValue(XMLNode *this,char *str,bool staticMem)

{
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,staticMem) != 0) {
    StrPair::Reset(&this->_value);
    (this->_value)._start = str;
    return;
  }
  StrPair::SetStr(&this->_value,str,0);
  return;
}

Assistant:

void XMLNode::SetValue( const char* str, bool staticMem )
{
    if ( staticMem ) {
        _value.SetInternedStr( str );
    }
    else {
        _value.SetStr( str );
    }
}